

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgipr(fitsfile *infptr,int maxaxis,int *bitpix,int *naxis,long *naxes,int *status)

{
  fitsfile *in_RCX;
  long in_RDX;
  undefined4 in_ESI;
  int *in_R8;
  int *in_R9;
  int nlen;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  if (*in_R9 < 1) {
    if (in_RDX != 0) {
      ffgidt(in_RCX,in_R8,in_R9);
    }
    nlen = (int)((ulong)in_RDX >> 0x20);
    if (in_RCX != (fitsfile *)0x0) {
      ffgidm(in_RCX,in_R8,in_R9);
    }
    if (in_R8 != (int *)0x0) {
      ffgisz((fitsfile *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),nlen,(long *)in_RCX,in_R8);
    }
    local_4 = *in_R9;
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffgipr(fitsfile *infptr,   /* I - FITS file pointer                     */
        int maxaxis,           /* I - max number of axes to return          */
        int *bitpix,           /* O - image data type                       */
        int *naxis,            /* O - image dimension (NAXIS value)         */
        long *naxes,           /* O - size of image dimensions              */
        int *status)           /* IO - error status      */

/*
    get the datatype and size of the input image
*/
{

    if (*status > 0)
        return(*status);

    /* don't return the parameter if a null pointer was given */

    if (bitpix)
      fits_get_img_type(infptr, bitpix, status);  /* get BITPIX value */

    if (naxis)
      fits_get_img_dim(infptr, naxis, status);    /* get NAXIS value */

    if (naxes)
      fits_get_img_size(infptr, maxaxis, naxes, status); /* get NAXISn values */

    return(*status);
}